

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void anon_unknown.dwarf_5292d::two_product_presplit
               (double a,double b,double bhi,double blo,double *x,double *y)

{
  double err3;
  double err2;
  double err1;
  double alo;
  double ahi;
  double *y_local;
  double *x_local;
  double blo_local;
  double bhi_local;
  double b_local;
  double a_local;
  
  *x = a * b;
  ahi = (double)y;
  y_local = x;
  x_local = (double *)blo;
  blo_local = bhi;
  bhi_local = b;
  b_local = a;
  GEO::split(a,&alo,&err1);
  *(double *)ahi =
       err1 * (double)x_local +
       -(-alo * (double)x_local + -err1 * blo_local + -alo * blo_local + *y_local);
  return;
}

Assistant:

inline void two_product_presplit(
        double a, double b, double bhi, double blo, double& x, double& y
    ) {
        x = a * b;
        double ahi;
        double alo;
        split(a, ahi, alo);
        double err1 = x - (ahi * bhi);
        double err2 = err1 - (alo * bhi);
        double err3 = err2 - (ahi * blo);
        y = (alo * blo) - err3;
    }